

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::Expression_const*,5u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,5u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,8u,false>,true>
          (IntervalMap<unsigned_long,slang::ast::Expression_const*,5u> *this,
          LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *rootNode,
          uint32_t position,allocator_type *alloc)

{
  interval<unsigned_long> *piVar1;
  unsigned_long *puVar2;
  uint uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  bool bVar6;
  LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false> *pLVar7;
  bool bVar8;
  ulong *puVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  uint *puVar17;
  int iVar18;
  uint32_t sizes [2];
  uint32_t local_58;
  uint local_54;
  ulong local_50 [2];
  IndexPair local_40;
  IntervalMap<unsigned_long,slang::ast::Expression_const*,5u> *local_38;
  
  puVar17 = &local_58;
  puVar14 = &local_58;
  local_38 = this;
  local_40 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0x7c),8,&local_58,position);
  uVar12 = 0;
  puVar9 = local_50 + 1;
  local_50[1] = 0;
  local_50[0] = 0;
  bVar6 = true;
  do {
    bVar8 = bVar6;
    pLVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Expression_const*,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar3 = *puVar17;
    iVar18 = (int)uVar12;
    if (uVar3 != 0) {
      lVar11 = 0;
      uVar10 = uVar3;
      do {
        piVar1 = (rootNode->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                 ).first + uVar12;
        uVar5 = piVar1->right;
        puVar2 = (unsigned_long *)
                 ((long)&(pLVar7->
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                         ).first[0].left + lVar11 * 2);
        *puVar2 = piVar1->left;
        puVar2[1] = uVar5;
        *(Expression **)
         ((long)(pLVar7->
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                ).second + lVar11) =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
             ).second[uVar12];
        uVar12 = (ulong)((int)uVar12 + 1);
        lVar11 = lVar11 + 8;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    uVar12 = (ulong)(iVar18 + uVar3);
    *puVar9 = (ulong)pLVar7 & 0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    puVar9 = local_50;
    puVar17 = &local_54;
    bVar6 = false;
  } while (bVar8);
  *(undefined8 *)(local_38 + 0x60) = 0;
  *(undefined8 *)(local_38 + 0x68) = 0;
  *(undefined8 *)(local_38 + 0x50) = 0;
  *(undefined8 *)(local_38 + 0x58) = 0;
  *(undefined8 *)(local_38 + 0x40) = 0;
  *(undefined8 *)(local_38 + 0x48) = 0;
  *(undefined8 *)(local_38 + 0x30) = 0;
  *(undefined8 *)(local_38 + 0x38) = 0;
  *(undefined8 *)(local_38 + 0x20) = 0;
  *(undefined8 *)(local_38 + 0x28) = 0;
  *(undefined8 *)(local_38 + 0x10) = 0;
  *(undefined8 *)(local_38 + 0x18) = 0;
  *(undefined8 *)local_38 = 0;
  *(undefined8 *)(local_38 + 8) = 0;
  *(undefined8 *)(local_38 + 0x70) = 0;
  lVar11 = 0;
  puVar9 = local_50 + 1;
  bVar6 = true;
  do {
    bVar8 = bVar6;
    uVar12 = *puVar9;
    puVar13 = (undefined8 *)(uVar12 & 0xffffffffffffffc0);
    uVar15 = puVar13[1];
    if (1 < (ulong)*puVar14) {
      lVar16 = 0;
      do {
        uVar4 = *(ulong *)((long)puVar13 + lVar16 + 0x18);
        if (uVar15 <= uVar4) {
          uVar15 = uVar4;
        }
        lVar16 = lVar16 + 0x10;
      } while ((ulong)*puVar14 * 0x10 + -0x10 != lVar16);
    }
    *(undefined8 *)(local_38 + lVar11 * 0x10 + 0x28) = *puVar13;
    *(ulong *)(local_38 + lVar11 * 0x10 + 0x30) = uVar15;
    *(ulong *)(local_38 + lVar11 * 8) = uVar12;
    lVar11 = 1;
    puVar14 = &local_54;
    puVar9 = local_50;
    bVar6 = false;
  } while (bVar8);
  *(undefined4 *)(local_38 + 0x7c) = 2;
  *(int *)(local_38 + 0x78) = *(int *)(local_38 + 0x78) + 1;
  return local_40;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}